

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skippable_text.hpp
# Opt level: O0

cpair __thiscall
skippable_text<unsigned_int,_unsigned_int>::pair_ending_at
          (skippable_text<unsigned_int,_unsigned_int> *this,uint i)

{
  bool bVar1;
  uint uVar2;
  uint i_00;
  undefined4 in_ESI;
  long in_RDI;
  uint unaff_retaddr;
  skippable_text<unsigned_int,_unsigned_int> *in_stack_00000008;
  uint i_1;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint local_20;
  uint in_stack_ffffffffffffffe4;
  cpair local_8;
  
  bVar1 = is_blank((skippable_text<unsigned_int,_unsigned_int> *)
                   CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc);
  if (bVar1) {
    uVar2 = *(uint *)(in_RDI + 4);
  }
  else {
    uVar2 = prev_non_blank_position(in_stack_00000008,unaff_retaddr);
  }
  if (uVar2 == *(uint *)(in_RDI + 4)) {
    local_8 = blank_pair((skippable_text<unsigned_int,_unsigned_int> *)
                         CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  else {
    i_00 = at((skippable_text<unsigned_int,_unsigned_int> *)CONCAT44(in_ESI,uVar2),
              in_stack_ffffffffffffffe4);
    local_20 = at((skippable_text<unsigned_int,_unsigned_int> *)CONCAT44(in_ESI,uVar2),i_00);
    std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int,_unsigned_int,_true>
              (&local_8,(uint *)&stack0xffffffffffffffe4,&local_20);
  }
  return local_8;
}

Assistant:

cpair pair_ending_at(itype i){

		assert(i<T.size());

		itype i_1 = is_blank(i) ? null : prev_non_blank_position(i);

		return i_1 == null ? blank_pair() : cpair {at(i_1),at(i)};

	}